

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O1

void KINFree(void **kinmem)

{
  void *pvVar1;
  
  pvVar1 = *kinmem;
  if (pvVar1 != (void *)0x0) {
    if (*(long *)((long)pvVar1 + 0x110) != 0) {
      N_VDestroy();
      *(undefined8 *)((long)pvVar1 + 0x110) = 0;
      *(long *)((long)pvVar1 + 0x210) =
           *(long *)((long)pvVar1 + 0x210) - *(long *)((long)pvVar1 + 0x200);
      *(long *)((long)pvVar1 + 0x218) =
           *(long *)((long)pvVar1 + 0x218) - *(long *)((long)pvVar1 + 0x208);
    }
    if (*(long *)((long)pvVar1 + 0x118) != 0) {
      N_VDestroy();
      *(undefined8 *)((long)pvVar1 + 0x118) = 0;
      *(long *)((long)pvVar1 + 0x210) =
           *(long *)((long)pvVar1 + 0x210) - *(long *)((long)pvVar1 + 0x200);
      *(long *)((long)pvVar1 + 0x218) =
           *(long *)((long)pvVar1 + 0x218) - *(long *)((long)pvVar1 + 0x208);
    }
    if (*(long *)((long)pvVar1 + 0x138) != 0) {
      N_VDestroy();
      *(undefined8 *)((long)pvVar1 + 0x138) = 0;
      *(long *)((long)pvVar1 + 0x210) =
           *(long *)((long)pvVar1 + 0x210) - *(long *)((long)pvVar1 + 0x200);
      *(long *)((long)pvVar1 + 0x218) =
           *(long *)((long)pvVar1 + 0x218) - *(long *)((long)pvVar1 + 0x208);
    }
    if (*(long *)((long)pvVar1 + 0x148) != 0) {
      N_VDestroy();
      *(undefined8 *)((long)pvVar1 + 0x148) = 0;
      *(long *)((long)pvVar1 + 0x210) =
           *(long *)((long)pvVar1 + 0x210) - *(long *)((long)pvVar1 + 0x200);
      *(long *)((long)pvVar1 + 0x218) =
           *(long *)((long)pvVar1 + 0x218) - *(long *)((long)pvVar1 + 0x208);
    }
    if (*(long *)((long)pvVar1 + 0x150) != 0) {
      N_VDestroy();
      *(undefined8 *)((long)pvVar1 + 0x150) = 0;
      *(long *)((long)pvVar1 + 0x210) =
           *(long *)((long)pvVar1 + 0x210) - *(long *)((long)pvVar1 + 0x200);
      *(long *)((long)pvVar1 + 0x218) =
           *(long *)((long)pvVar1 + 0x218) - *(long *)((long)pvVar1 + 0x208);
    }
    if (*(long *)((long)pvVar1 + 0x158) != 0) {
      N_VDestroy();
      *(undefined8 *)((long)pvVar1 + 0x158) = 0;
      *(long *)((long)pvVar1 + 0x210) =
           *(long *)((long)pvVar1 + 0x210) - *(long *)((long)pvVar1 + 0x200);
      *(long *)((long)pvVar1 + 0x218) =
           *(long *)((long)pvVar1 + 0x218) - *(long *)((long)pvVar1 + 0x208);
    }
    if (*(long *)((long)pvVar1 + 0x120) != 0) {
      N_VDestroy();
      *(undefined8 *)((long)pvVar1 + 0x120) = 0;
      *(long *)((long)pvVar1 + 0x210) =
           *(long *)((long)pvVar1 + 0x210) - *(long *)((long)pvVar1 + 0x200);
      *(long *)((long)pvVar1 + 0x218) =
           *(long *)((long)pvVar1 + 0x218) - *(long *)((long)pvVar1 + 0x208);
    }
    if (*(void **)((long)pvVar1 + 0x1a8) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 0x1a8));
      *(undefined8 *)((long)pvVar1 + 0x1a8) = 0;
    }
    if (*(void **)((long)pvVar1 + 0x1a0) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 0x1a0));
      *(undefined8 *)((long)pvVar1 + 0x1a0) = 0;
    }
    if (*(void **)((long)pvVar1 + 0x1b8) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 0x1b8));
      *(undefined8 *)((long)pvVar1 + 0x1b8) = 0;
    }
    if (*(void **)((long)pvVar1 + 0x1f0) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 0x1f0));
      *(undefined8 *)((long)pvVar1 + 0x1f0) = 0;
    }
    if (*(void **)((long)pvVar1 + 0x1f8) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 0x1f8));
      *(undefined8 *)((long)pvVar1 + 0x1f8) = 0;
    }
    if (*(long *)((long)pvVar1 + 0x170) != 0) {
      N_VDestroy();
      *(undefined8 *)((long)pvVar1 + 0x170) = 0;
      *(long *)((long)pvVar1 + 0x210) =
           *(long *)((long)pvVar1 + 0x210) - *(long *)((long)pvVar1 + 0x200);
      *(long *)((long)pvVar1 + 0x218) =
           *(long *)((long)pvVar1 + 0x218) - *(long *)((long)pvVar1 + 0x208);
    }
    if (*(long *)((long)pvVar1 + 0x178) != 0) {
      N_VDestroy();
      *(undefined8 *)((long)pvVar1 + 0x178) = 0;
      *(long *)((long)pvVar1 + 0x210) =
           *(long *)((long)pvVar1 + 0x210) - *(long *)((long)pvVar1 + 0x200);
      *(long *)((long)pvVar1 + 0x218) =
           *(long *)((long)pvVar1 + 0x218) - *(long *)((long)pvVar1 + 0x208);
    }
    if (*(long *)((long)pvVar1 + 0x180) != 0) {
      N_VDestroyVectorArray(*(long *)((long)pvVar1 + 0x180),*(undefined4 *)((long)pvVar1 + 0x1c0));
      *(undefined8 *)((long)pvVar1 + 0x180) = 0;
      *(long *)((long)pvVar1 + 0x210) =
           *(long *)((long)pvVar1 + 0x210) -
           *(long *)((long)pvVar1 + 0x200) * *(long *)((long)pvVar1 + 0x1c0);
      *(long *)((long)pvVar1 + 0x218) =
           *(long *)((long)pvVar1 + 0x218) -
           *(long *)((long)pvVar1 + 0x1c0) * *(long *)((long)pvVar1 + 0x208);
    }
    if (*(long *)((long)pvVar1 + 0x188) != 0) {
      N_VDestroyVectorArray(*(long *)((long)pvVar1 + 0x188),*(undefined4 *)((long)pvVar1 + 0x1c0));
      *(undefined8 *)((long)pvVar1 + 0x188) = 0;
      *(long *)((long)pvVar1 + 0x210) =
           *(long *)((long)pvVar1 + 0x210) -
           *(long *)((long)pvVar1 + 0x200) * *(long *)((long)pvVar1 + 0x1c0);
      *(long *)((long)pvVar1 + 0x218) =
           *(long *)((long)pvVar1 + 0x218) -
           *(long *)((long)pvVar1 + 0x1c0) * *(long *)((long)pvVar1 + 0x208);
    }
    if (*(long *)((long)pvVar1 + 400) != 0) {
      N_VDestroyVectorArray(*(long *)((long)pvVar1 + 400),*(undefined4 *)((long)pvVar1 + 0x1c0));
      *(undefined8 *)((long)pvVar1 + 400) = 0;
      *(long *)((long)pvVar1 + 0x210) =
           *(long *)((long)pvVar1 + 0x210) -
           *(long *)((long)pvVar1 + 0x200) * *(long *)((long)pvVar1 + 0x1c0);
      *(long *)((long)pvVar1 + 0x218) =
           *(long *)((long)pvVar1 + 0x218) -
           *(long *)((long)pvVar1 + 0x1c0) * *(long *)((long)pvVar1 + 0x208);
    }
    if (*(void **)((long)pvVar1 + 0x1e0) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 0x1e0));
      *(undefined8 *)((long)pvVar1 + 0x1e0) = 0;
    }
    if (*(void **)((long)pvVar1 + 0x1b0) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 0x1b0));
      *(undefined8 *)((long)pvVar1 + 0x1b0) = 0;
    }
    if (*(long *)((long)pvVar1 + 0x140) != 0) {
      N_VDestroy();
      *(undefined8 *)((long)pvVar1 + 0x140) = 0;
      *(long *)((long)pvVar1 + 0x210) =
           *(long *)((long)pvVar1 + 0x210) - *(long *)((long)pvVar1 + 0x200);
      *(long *)((long)pvVar1 + 0x218) =
           *(long *)((long)pvVar1 + 0x218) - *(long *)((long)pvVar1 + 0x208);
    }
    if (*(code **)((long)pvVar1 + 0x238) != (code *)0x0) {
      (**(code **)((long)pvVar1 + 0x238))(pvVar1);
    }
    free(*kinmem);
    *kinmem = (void *)0x0;
  }
  return;
}

Assistant:

void KINFree(void** kinmem)
{
  KINMem kin_mem;

  if (*kinmem == NULL) { return; }

  kin_mem = (KINMem)(*kinmem);
  KINFreeVectors(kin_mem);

  /* call lfree if non-NULL */

  if (kin_mem->kin_lfree != NULL) { kin_mem->kin_lfree(kin_mem); }

  free(*kinmem);
  *kinmem = NULL;
}